

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  istream *piVar3;
  value_type vVar4;
  long local_890;
  ifstream file;
  char local_681;
  value_type vStack_680;
  char separator;
  double y;
  double x;
  regression<double,_64UL> filter;
  char **argv_local;
  int argc_local;
  
  filter.x_moment.sum.variance = (value_type)argv;
  if (argc == 2) {
    trial::online::window::regression<double,_64UL>::regression((regression<double,_64UL> *)&x);
    std::ifstream::ifstream(&local_890,*(undefined8 *)((long)filter.x_moment.sum.variance + 8),8);
    while( true ) {
      bVar1 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&local_890 + *(long *)(local_890 + -0x18)));
      if (!bVar1) break;
      piVar3 = (istream *)std::istream::operator>>((istream *)&local_890,&y);
      piVar3 = std::operator>>(piVar3,&local_681);
      std::istream::operator>>(piVar3,&stack0xfffffffffffff980);
      trial::online::window::regression<double,_64UL>::push
                ((regression<double,_64UL> *)&x,y,vStack_680);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,y);
      poVar2 = std::operator<<(poVar2,',');
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,vStack_680);
      poVar2 = std::operator<<(poVar2,',');
      vVar4 = trial::online::window::regression<double,_64UL>::slope((regression<double,_64UL> *)&x)
      ;
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,vVar4);
      poVar2 = std::operator<<(poVar2,',');
      vVar4 = trial::online::window::regression<double,_64UL>::at
                        ((regression<double,_64UL> *)&x,0.0);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,vVar4);
      std::operator<<(poVar2,'\n');
    }
    argv_local._4_4_ = 0;
    std::ifstream::~ifstream(&local_890);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar2 = std::operator<<(poVar2,*(char **)filter.x_moment.sum.variance);
    poVar2 = std::operator<<(poVar2," <file>");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char *argv[])
{
    if (argc != 2)
    {
        std::cerr << "Usage: " << argv[0] << " <file>" << std::endl;
        return 1;
    }

    window::regression<double, 64> filter;

    double x;
    double y;
    char separator;

    std::ifstream file(argv[1]);
    while (file)
    {
        file >> x >> separator >> y;
        filter.push(x, y);
        std::cout << x << ',' << y << ',' << filter.slope() << ',' << filter.at(0) << '\n';
    }
    return 0;
}